

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void test_export_simple_ltc(void)

{
  ostream *poVar1;
  vec<3,_float,_(glm::precision)0> vVar2;
  allocator<char> local_199;
  string local_198;
  undefined8 local_178;
  float local_170;
  vec<3,_float,_(glm::precision)0> local_164;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_158;
  undefined1 local_148 [8];
  brdf_plot plot;
  mat<3,_3,_float,_(glm::precision)0> local_ac;
  undefined1 local_88 [8];
  ltc ltc;
  
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1,"VISUAL TEST: test_export_simple_ltc started.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  ::ltc::ltc((ltc *)local_88);
  glm::mat<3,_3,_float,_(glm::precision)0>::mat(&local_ac,1.0);
  ::ltc::set_ltc_matrix((ltc *)local_88,&local_ac);
  brdf_plot::brdf_plot((brdf_plot *)local_148);
  glm::vec<3,_float,_(glm::precision)0>::vec(&local_164,1.0,0.0,1.0);
  vVar2 = glm::normalize<3,float,(glm::precision)0,glm::vec>(&local_164);
  local_170 = vVar2.field_0._8_4_;
  local_178 = vVar2.field_0._0_8_;
  local_158._0_8_ = local_178;
  local_158.field_0.z = local_170;
  brdf_plot::set_view_dir((brdf_plot *)local_148,(vec3 *)&local_158.field_0);
  brdf_plot::set_resolution((brdf_plot *)local_148,0x200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"test_export_simple_ltc.png",&local_199);
  brdf_plot::export_png((brdf_plot *)local_148,(brdf *)local_88,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1,"VISUAL TEST: expored to \'test_export_simple_ltc.png\'");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1,"VISUAL TEST: test_export_simple_ltc completed.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  brdf_plot::~brdf_plot((brdf_plot *)local_148);
  ::ltc::~ltc((ltc *)local_88);
  return;
}

Assistant:

void test_export_simple_ltc()
{
    log_info() << "VISUAL TEST: test_export_simple_ltc started." << std::endl;

    ltc ltc;
    ltc.set_ltc_matrix(glm::mat3{1.0f});

    brdf_plot plot;
    plot.set_view_dir(glm::normalize(glm::vec3{1.0f, 0.0f, 1.0f}));
    plot.set_resolution(512);
    plot.export_png(&ltc, "test_export_simple_ltc.png");

    log_info() << "VISUAL TEST: expored to 'test_export_simple_ltc.png'"
        << std::endl;
    log_info() << "VISUAL TEST: test_export_simple_ltc completed." << std::endl;
}